

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict1 *caseDef)

{
  int *piVar1;
  VkAccessFlags *pVVar2;
  undefined8 *puVar3;
  uint uVar4;
  VkImageViewType VVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var6;
  deUint64 dVar7;
  undefined8 uVar8;
  TestLog *log;
  deUint32 dVar9;
  VkImageSubresourceRange subresourceRange;
  undefined8 uVar10;
  VkPipelineBindPoint VVar11;
  undefined8 obj;
  undefined8 renderPass;
  undefined8 uVar12;
  undefined8 commandBuffer;
  undefined8 uVar13;
  void *pvVar14;
  undefined8 uVar15;
  TestStatus *pTVar16;
  bool bVar17;
  int i_1;
  deUint32 dVar18;
  int iVar19;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar20;
  Allocator *allocator;
  TextureFormat format_00;
  const_iterator cVar21;
  deUint64 *pdVar22;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar23;
  VkImageCreateFlags VVar24;
  long lVar25;
  int iVar26;
  VkDeviceSize bufferSize;
  deUint32 dVar27;
  int iVar28;
  long lVar29;
  VkSubpassDescription *pVVar30;
  pointer pVVar31;
  VkImageType imageType;
  ulong uVar32;
  deUint32 i;
  int iVar33;
  ulong uVar34;
  byte bVar35;
  undefined4 uVar36;
  VkImageUsageFlags in_stack_fffffffffffffbe8;
  undefined1 multisample;
  undefined8 in_stack_fffffffffffffbf0;
  long *plVar37;
  long *local_408;
  VkImageViewType local_3dc;
  VkImageMemoryBarrier imageClearBarriers [1];
  VkBufferCreateInfo bufferCreateInfo;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  Move<vk::Handle<(vk::HandleType)9>_> msColorImage;
  VkClearColorValue clearColor;
  long local_1d8 [2];
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  Move<vk::Handle<(vk::HandleType)13>_> local_188;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_140;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_e0;
  TestStatus *local_c0;
  VkQueue local_b8;
  TextureFormat format;
  IVec3 local_a8;
  VkCommandPool local_98;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_90;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkPipelineLayout local_58;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_50;
  
  bVar35 = 0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar20 = Context::getUniversalQueue(context);
  dVar18 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  iVar28 = (caseDef->attachmentSize).m_data[1];
  iVar33 = (caseDef->attachmentSize).m_data[0];
  iVar26 = (caseDef->attachmentSize).m_data[2];
  dVar27 = caseDef->numLayers;
  format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar19 = tcu::getPixelSize(format_00);
  makeBufferCreateInfo(&bufferCreateInfo,(ulong)(iVar28 * iVar33 * iVar26 * dVar27 * iVar19),2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)imageClearBarriers,vk,device,
                     &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = imageClearBarriers[0]._0_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)imageClearBarriers[0].pNext;
  DStack_e0.m_device = (VkDevice)imageClearBarriers[0]._16_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)imageClearBarriers[0]._0_8_,(MemoryRequirement)0x1);
  uVar12 = bufferCreateInfo._0_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = pVVar20;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = caseDef->numLayers;
  uVar32 = (ulong)uVar4;
  bVar17 = caseDef->multisample;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&attachmentDescriptions,uVar32,(allocator_type *)&bufferCreateInfo);
  local_c0 = __return_storage_ptr__;
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             &framebuffer,uVar32,(allocator_type *)&bufferCreateInfo);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar4 != 0) {
    lVar29 = 0;
    do {
      *(undefined8 *)
       ((long)&(attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start)->flags + lVar29) = 0x2500000000;
      *(uint *)((long)&(attachmentDescriptions.
                        super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                        ._M_impl.super__Vector_impl_data._M_start)->samples + lVar29) =
           (uint)bVar17 + (uint)bVar17 * 2 + 1;
      puVar3 = (undefined8 *)
               ((long)&(attachmentDescriptions.
                        super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                        ._M_impl.super__Vector_impl_data._M_start)->loadOp + lVar29);
      *puVar3 = 0;
      puVar3[1] = 0x100000002;
      *(undefined8 *)
       ((long)&(attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start)->initialLayout + lVar29) = 0x200000001;
      lVar29 = lVar29 + 0x24;
    } while (uVar32 * 0x24 != lVar29);
    lVar29 = 0;
    uVar34 = 0;
    do {
      lVar25 = framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal +
               lVar29;
      *(int *)(framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal +
              lVar29) = (int)uVar34;
      *(undefined4 *)
       (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal + 4 +
       lVar29) = 2;
      bufferCreateInfo.flags = 0;
      bufferCreateInfo._20_4_ = 0;
      bufferCreateInfo.size._4_4_ = 0;
      bufferCreateInfo.queueFamilyIndexCount = 0;
      bufferCreateInfo._44_4_ = 0;
      bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferCreateInfo._4_4_ = 0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo.size._0_4_ = 1;
      bufferCreateInfo.usage = (VkBufferUsageFlags)lVar25;
      bufferCreateInfo.sharingMode = (VkSharingMode)((ulong)lVar25 >> 0x20);
      if (subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        bufferCreateInfo._32_8_ = lVar25;
        std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
        _M_realloc_insert<vk::VkSubpassDescription_const&>
                  ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
                   &subpasses,
                   (iterator)
                   subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkSubpassDescription *)&bufferCreateInfo);
      }
      else {
        pVVar30 = (VkSubpassDescription *)&bufferCreateInfo;
        pVVar31 = subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
          VVar11 = pVVar30->pipelineBindPoint;
          pVVar31->flags = pVVar30->flags;
          pVVar31->pipelineBindPoint = VVar11;
          pVVar30 = (VkSubpassDescription *)((long)pVVar30 + (ulong)bVar35 * -0x10 + 8);
          pVVar31 = (pointer)((long)pVVar31 + (ulong)bVar35 * -0x10 + 8);
        }
        subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             subpasses.
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar34 = uVar34 + 1;
      lVar29 = lVar29 + 8;
    } while (uVar32 != uVar34);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = (ulong)uVar4 << 0x20;
  bufferCreateInfo.size._0_4_ =
       (VkImageLayout)
       attachmentDescriptions.
       super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.size._4_4_ =
       (VkImageLayout)
       ((ulong)attachmentDescriptions.
               super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  bufferCreateInfo.usage =
       (int)((ulong)((long)subpasses.
                           super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  bufferCreateInfo._40_8_ =
       subpasses.
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices._4_4_ << 0x20);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)imageClearBarriers,vk,device,
             (VkRenderPassCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(subpasses.
                    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    operator_delete((void *)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object
                            .m_internal,
                    (long)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                          m_device -
                    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
                    m_internal);
  }
  if (attachmentDescriptions.
      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentDescriptions.
                    super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  renderPass = imageClearBarriers[0]._0_8_;
  pVVar2 = &imageClearBarriers[0].srcAccessMask;
  DStack_140.m_deviceIface = (DeviceInterface *)imageClearBarriers[0].pNext;
  DStack_140.m_device._0_4_ = imageClearBarriers[0].srcAccessMask;
  DStack_140.m_device._4_4_ = imageClearBarriers[0].dstAccessMask;
  DStack_140.m_allocator._0_4_ = imageClearBarriers[0].oldLayout;
  DStack_140.m_allocator._4_4_ = imageClearBarriers[0].newLayout;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  p_Var6 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  imageClearBarriers[0]._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)imageClearBarriers,"vert","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var6,(key_type *)imageClearBarriers);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((VkAccessFlags *)imageClearBarriers[0]._0_8_ != pVVar2) {
    operator_delete((void *)imageClearBarriers[0]._0_8_,imageClearBarriers[0]._16_8_ + 1);
  }
  p_Var6 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  imageClearBarriers[0]._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)imageClearBarriers,"frag","");
  cVar21 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var6,(key_type *)imageClearBarriers);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar21._M_node + 2),0);
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_78.m_internal = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((VkAccessFlags *)imageClearBarriers[0]._0_8_ != pVVar2) {
    operator_delete((void *)imageClearBarriers[0]._0_8_,imageClearBarriers[0]._16_8_ + 1);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,dVar18,
             (VkAllocationCallbacks *)0x0);
  DStack_90.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
  DStack_90.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_98.m_internal = bufferCreateInfo._0_8_;
  DStack_90.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  uVar15 = bufferCreateInfo._16_8_;
  pvVar14 = bufferCreateInfo.pNext;
  commandBuffer = bufferCreateInfo._0_8_;
  multisample = (undefined1)in_stack_fffffffffffffbf0;
  uVar10 = CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
  VVar5 = caseDef->imageType;
  local_3dc = VK_IMAGE_VIEW_TYPE_2D;
  if ((VVar5 != VK_IMAGE_VIEW_TYPE_CUBE) && (VVar5 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
    local_3dc = VVar5;
  }
  dVar27 = caseDef->numLayers;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)dVar27) {
    do {
      bufferCreateInfo.sType = 0xbf800000;
      bufferCreateInfo._4_4_ = 0xbf800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0xbf800000;
      bufferCreateInfo._4_4_ = 0x3f800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0x3f800000;
      bufferCreateInfo._4_4_ = 0xbf800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0x3f800000;
      bufferCreateInfo._4_4_ = 0x3f800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      multisample = (undefined1)in_stack_fffffffffffffbf0;
      dVar27 = dVar27 - 1;
    } while (dVar27 != 0);
  }
  bufferSize = (long)attachmentDescriptions.
                     super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)attachmentDescriptions.
                     super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)imageClearBarriers,vk,device,
                     &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo.flags = imageClearBarriers[0].srcAccessMask;
  bufferCreateInfo._20_4_ = imageClearBarriers[0].dstAccessMask;
  bufferCreateInfo.sType = imageClearBarriers[0].sType;
  bufferCreateInfo._4_4_ = imageClearBarriers[0]._4_4_;
  bufferCreateInfo.pNext = imageClearBarriers[0].pNext;
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  imageClearBarriers[0].pNext = (void *)0x0;
  imageClearBarriers[0].srcAccessMask = 0;
  imageClearBarriers[0].dstAccessMask = 0;
  imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (imageClearBarriers[0]._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&imageClearBarriers[0].pNext,
               (VkBuffer)imageClearBarriers[0]._0_8_);
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,
             (VkBuffer)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  uVar13 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         attachmentDescriptions.
         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar13 + 8),*(VkDeviceSize *)(uVar13 + 0x10),
             bufferSize);
  if (attachmentDescriptions.
      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentDescriptions.
                    super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  imageType = (int)caseDef + 0x10;
  VVar24 = 3;
  if ((ulong)caseDef->imageType < 7) {
    VVar24 = *(VkImageCreateFlags *)(&DAT_00b16da0 + (ulong)caseDef->imageType * 4);
  }
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)imageClearBarriers,vk,device,VVar24,imageType,
            caseDef->numLayers,(IVec3 *)0x13,0,in_stack_fffffffffffffbe8,(bool)multisample);
  bufferCreateInfo.flags = imageClearBarriers[0].srcAccessMask;
  bufferCreateInfo._20_4_ = imageClearBarriers[0].dstAccessMask;
  bufferCreateInfo.size._0_4_ = imageClearBarriers[0].oldLayout;
  bufferCreateInfo.size._4_4_ = imageClearBarriers[0].newLayout;
  bufferCreateInfo.sType = imageClearBarriers[0].sType;
  bufferCreateInfo._4_4_ = imageClearBarriers[0]._4_4_;
  bufferCreateInfo.pNext = imageClearBarriers[0].pNext;
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  imageClearBarriers[0].pNext = (void *)0x0;
  imageClearBarriers[0].srcAccessMask = 0;
  imageClearBarriers[0].dstAccessMask = 0;
  imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (imageClearBarriers[0]._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&imageClearBarriers[0].pNext,
               (VkImage)imageClearBarriers[0]._0_8_);
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
            device,allocator,
            (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  plVar37 = (long *)bufferCreateInfo._0_8_;
  if (caseDef->multisample == true) {
    VVar24 = 3;
    if ((ulong)caseDef->imageType < 7) {
      VVar24 = *(VkImageCreateFlags *)(&DAT_00b16da0 + (ulong)caseDef->imageType * 4);
    }
    makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)imageClearBarriers,vk,device,VVar24,imageType,
              caseDef->numLayers,(IVec3 *)0x13,1,in_stack_fffffffffffffbe8,
              bufferCreateInfo.sType._0_1_);
    bufferCreateInfo.flags = imageClearBarriers[0].srcAccessMask;
    bufferCreateInfo._20_4_ = imageClearBarriers[0].dstAccessMask;
    bufferCreateInfo.size._0_4_ = imageClearBarriers[0].oldLayout;
    bufferCreateInfo.size._4_4_ = imageClearBarriers[0].newLayout;
    bufferCreateInfo.sType = imageClearBarriers[0].sType;
    bufferCreateInfo._4_4_ = imageClearBarriers[0]._4_4_;
    bufferCreateInfo.pNext = imageClearBarriers[0].pNext;
    imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageClearBarriers[0]._4_4_ = 0;
    imageClearBarriers[0].pNext = (void *)0x0;
    imageClearBarriers[0].srcAccessMask = 0;
    imageClearBarriers[0].dstAccessMask = 0;
    imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)bufferCreateInfo._16_8_;
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         bufferCreateInfo._0_8_;
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferCreateInfo.pNext;
    if (imageClearBarriers[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&imageClearBarriers[0].pNext,
                 (VkImage)imageClearBarriers[0]._0_8_);
    }
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
              device,allocator,
              (VkImage)msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,(MemoryRequirement)0x0);
    local_408 = (long *)bufferCreateInfo._0_8_;
  }
  else {
    local_408 = (long *)0x0;
  }
  dVar27 = caseDef->numLayers;
  if (dVar27 != 0) {
    dVar18 = 0;
    do {
      pMVar23 = &colorImage;
      if (caseDef->multisample != false) {
        pMVar23 = &msColorImage;
      }
      res.aspectMask = 1;
      res.baseMipLevel = 0;
      res.levelCount = 1;
      res.layerCount = 1;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = dVar18;
      subresourceRange.layerCount = 1;
      res.baseArrayLayer = dVar18;
      makeImageView(&local_188,vk,device,
                    (VkImage)(pMVar23->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                             m_internal,local_3dc,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
      pdVar22 = (deUint64 *)operator_new(0x20);
      pdVar22[2] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
      pdVar22[3] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_allocator;
      *pdVar22 = local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      pdVar22[1] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_deviceIface;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar22;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d53520;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar22;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                  *)&colorAttachments,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImageView)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
                  );
      }
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                  ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                    *)&attachmentHandles,
                   (iterator)
                   attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (Handle<(vk::HandleType)13> *)
                   colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (attachmentHandles.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
             ((colorAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_a8.m_data._0_8_ = *(undefined8 *)(caseDef->renderSize).m_data;
      local_a8.m_data[2] = (caseDef->renderSize).m_data[2];
      makeGraphicsPipeline
                (&local_1a8,vk,device,local_58,(VkRenderPass)renderPass,
                 (VkShaderModule)
                 subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_78,&local_a8,
                 VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,dVar18,true,caseDef->multisample);
      pdVar22 = (deUint64 *)operator_new(0x20);
      pdVar22[2] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      pdVar22[3] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_allocator;
      *pdVar22 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      pdVar22[1] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_deviceIface;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar22;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d53760;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar22;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                  *)&pipeline,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      dVar18 = dVar18 + 1;
      dVar27 = caseDef->numLayers;
    } while (dVar18 < dVar27);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)imageClearBarriers,vk,device,
                  (VkRenderPass)renderPass,dVar27,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  bufferCreateInfo.flags = imageClearBarriers[0].srcAccessMask;
  bufferCreateInfo._20_4_ = imageClearBarriers[0].dstAccessMask;
  bufferCreateInfo.size._0_4_ = imageClearBarriers[0].oldLayout;
  bufferCreateInfo.size._4_4_ = imageClearBarriers[0].newLayout;
  bufferCreateInfo.sType = imageClearBarriers[0].sType;
  bufferCreateInfo._4_4_ = imageClearBarriers[0]._4_4_;
  bufferCreateInfo.pNext = imageClearBarriers[0].pNext;
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  imageClearBarriers[0].pNext = (void *)0x0;
  imageClearBarriers[0].srcAccessMask = 0;
  imageClearBarriers[0].dstAccessMask = 0;
  imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(VkImageLayout)bufferCreateInfo.size);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (imageClearBarriers[0]._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&imageClearBarriers[0].pNext,
               (VkFramebuffer)imageClearBarriers[0]._0_8_);
  }
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0x1000;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 7;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  pMVar23 = &colorImage;
  if (caseDef->multisample != false) {
    pMVar23 = &msColorImage;
  }
  bufferCreateInfo._40_8_ =
       (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,1,0x8000,0,0,0,0,0,1,(int)&bufferCreateInfo);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,caseDef->numLayers
                        );
  clearColor._0_8_ = 0;
  clearColor.float32[2] = 0.0;
  clearColor.int32[3] = 0x3f800000;
  pMVar23 = &colorImage;
  if (caseDef->multisample != false) {
    pMVar23 = &msColorImage;
  }
  (*vk->_vptr_DeviceInterface[0x66])
            (vk,commandBuffer,
             (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,7,
             &clearColor,1,(int)&attachmentDescriptions);
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageClearBarriers[0].pNext = (void *)0x0;
  imageClearBarriers[0].srcAccessMask = 0x1000;
  imageClearBarriers[0].dstAccessMask = 0x80;
  imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_GENERAL;
  imageClearBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  imageClearBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  pMVar23 = &colorImage;
  if (caseDef->multisample != false) {
    pMVar23 = &msColorImage;
  }
  dVar7 = (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  imageClearBarriers[0].image.m_internal._0_4_ = (uint)dVar7;
  imageClearBarriers[0].image.m_internal._4_4_ = (undefined4)(dVar7 >> 0x20);
  imageClearBarriers[0].subresourceRange.layerCount = caseDef->numLayers;
  imageClearBarriers[0].subresourceRange.aspectMask = 1;
  imageClearBarriers[0].subresourceRange.baseMipLevel = 0;
  imageClearBarriers[0].subresourceRange.levelCount = 1;
  imageClearBarriers[0].subresourceRange.baseArrayLayer = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x80,0,0,0,0,0,1,(int)imageClearBarriers);
  bufferCreateInfo.queueFamilyIndexCount = (caseDef->renderSize).m_data[0];
  bufferCreateInfo._44_4_ = (caseDef->renderSize).m_data[1];
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  imageClearBarriers[0].sType = (VkStructureType)renderPass;
  imageClearBarriers[0]._4_4_ = SUB84(renderPass,4);
  bufferCreateInfo.flags = imageClearBarriers[0].sType;
  bufferCreateInfo._20_4_ = imageClearBarriers[0]._4_4_;
  bufferCreateInfo.size._0_4_ =
       (VkImageLayout)
       framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  bufferCreateInfo.size._4_4_ =
       (VkImageLayout)
       (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal >> 0x20)
  ;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices & 0xffffffff00000000);
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,&bufferCreateInfo,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer,0,1,&vertexBuffer,imageClearBarriers);
  if (caseDef->numLayers != 0) {
    uVar34 = 0;
    uVar32 = 0;
    do {
      if (uVar34 != 0) {
        (*vk->_vptr_DeviceInterface[0x75])(vk,commandBuffer,0);
      }
      (*vk->_vptr_DeviceInterface[0x4c])
                (vk,commandBuffer,0,
                 **(undefined8 **)
                   ((long)&(pipeline.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar34 * 4));
      (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,4,1,uVar34 & 0xffffffff,0);
      uVar32 = uVar32 + 1;
      uVar34 = uVar34 + 4;
    } while (uVar32 < caseDef->numLayers);
  }
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer);
  uVar36 = SUB84(&bufferCreateInfo,0);
  if (caseDef->multisample == true) {
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0x100;
    bufferCreateInfo._20_4_ = 0x800;
    bufferCreateInfo.size._0_4_ = 2;
    bufferCreateInfo.size._4_4_ = 1;
    bufferCreateInfo.usage = 0xffffffff;
    bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo._40_8_ =
         msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
    (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x8000,0x8000,0,0,0,0,0,2,uVar36);
    imageClearBarriers[0].image.m_internal._0_4_ = caseDef->numLayers;
    imageClearBarriers[0].pNext =
         (void *)((ulong)(uint)imageClearBarriers[0].image.m_internal << 0x20);
    imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    imageClearBarriers[0]._4_4_ = 0;
    imageClearBarriers[0].srcAccessMask = 0;
    imageClearBarriers[0].dstAccessMask = 0;
    imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    imageClearBarriers[0].newLayout = VK_IMAGE_LAYOUT_GENERAL;
    imageClearBarriers[0].srcQueueFamilyIndex = 0;
    imageClearBarriers[0].dstQueueFamilyIndex = 0;
    imageClearBarriers[0].image.m_internal._4_4_ = 0;
    imageClearBarriers[0].subresourceRange.aspectMask = 0;
    imageClearBarriers[0].subresourceRange.baseMipLevel = 0;
    imageClearBarriers[0].subresourceRange.layerCount = (caseDef->attachmentSize).m_data[2];
    imageClearBarriers[0].subresourceRange.levelCount = (caseDef->attachmentSize).m_data[0];
    imageClearBarriers[0].subresourceRange.baseArrayLayer = (caseDef->attachmentSize).m_data[1];
    (*vk->_vptr_DeviceInterface[0x69])
              (vk,commandBuffer,
               msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1
               ,colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
               1,imageClearBarriers);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  if (caseDef->multisample != false) {
    bufferCreateInfo.flags = 0x1000;
  }
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size._0_4_ = 2 - (uint)caseDef->multisample;
  bufferCreateInfo.size._4_4_ = 6;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo._40_8_ =
       colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar36);
  imageClearBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageClearBarriers[0]._4_4_ = 0;
  imageClearBarriers[0].pNext = (void *)0x0;
  imageClearBarriers[0].newLayout = caseDef->numLayers;
  imageClearBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageClearBarriers[0].srcAccessMask = 1;
  imageClearBarriers[0].dstAccessMask = 0;
  imageClearBarriers[0].srcQueueFamilyIndex = 0;
  imageClearBarriers[0].dstQueueFamilyIndex = 0;
  imageClearBarriers[0].image.m_internal._0_4_ = 0;
  imageClearBarriers[0].subresourceRange.baseMipLevel = (caseDef->attachmentSize).m_data[2];
  uVar8 = *(undefined8 *)(caseDef->attachmentSize).m_data;
  imageClearBarriers[0].image.m_internal._4_4_ = (undefined4)uVar8;
  imageClearBarriers[0].subresourceRange.aspectMask = (VkImageAspectFlags)((ulong)uVar8 >> 0x20);
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,obj
             ,1,(int)imageClearBarriers);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x4000,0,0,0,1,(int)&attachmentDescriptions,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                    ,0x310);
  submitCommandsAndWait(vk,device,local_b8,(VkCommandBuffer)commandBuffer);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar12 + 8),*(VkDeviceSize *)(uVar12 + 0x10),
             0xffffffffffffffff);
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  dVar27 = (caseDef->attachmentSize).m_data[2];
  dVar18 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar27) {
    dVar18 = dVar27;
  }
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&bufferCreateInfo,&format,(caseDef->attachmentSize).m_data[0],
             (caseDef->attachmentSize).m_data[1],dVar18);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)imageClearBarriers,(TextureLevel *)&bufferCreateInfo);
  dVar27 = (caseDef->renderSize).m_data[2];
  dVar9 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar27) {
    dVar9 = dVar27;
  }
  if (0 < (int)imageClearBarriers[0].srcAccessMask) {
    iVar28 = 0;
    do {
      if (0 < imageClearBarriers[0].pNext._4_4_) {
        iVar33 = 0;
        do {
          if (0 < (int)imageClearBarriers[0].pNext) {
            iVar26 = 0;
            do {
              if (((iVar26 < (caseDef->renderSize).m_data[0]) && (iVar28 < (int)dVar9)) &&
                 (iVar33 < (caseDef->renderSize).m_data[1])) {
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)imageClearBarriers,(Vec4 *)&attachmentDescriptions,
                           iVar26,iVar33,iVar28);
              }
              else {
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)imageClearBarriers,(Vec4 *)&attachmentDescriptions,
                           iVar26,iVar33,iVar28);
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 < (int)imageClearBarriers[0].pNext);
          }
          iVar33 = iVar33 + 1;
        } while (iVar33 < imageClearBarriers[0].pNext._4_4_);
      }
      iVar28 = iVar28 + 1;
    } while (iVar28 < (int)imageClearBarriers[0].srcAccessMask);
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&attachmentDescriptions,&format,
             (caseDef->attachmentSize).m_data[0],(caseDef->attachmentSize).m_data[1],dVar18,
             *(void **)(uVar12 + 0x18));
  pTVar16 = local_c0;
  log = context->m_testCtx->m_log;
  lVar29 = 0;
  do {
    *(undefined4 *)((long)local_1d8 + lVar29 * 4 + -0x10) = 1;
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  bVar17 = tcu::intThresholdCompare
                     (log,"Image Comparison","",(ConstPixelBufferAccess *)imageClearBarriers,
                      (ConstPixelBufferAccess *)&attachmentDescriptions,(UVec4 *)&clearColor,
                      COMPARE_LOG_RESULT);
  if (bVar17) {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
  }
  else {
    clearColor._0_8_ = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"Fail","");
    pTVar16->m_code = QP_TEST_RESULT_FAIL;
    (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar16->m_description,clearColor._0_8_,
               CONCAT44(clearColor.int32[3],clearColor.int32[2]) + clearColor._0_8_);
    if ((long *)clearColor._0_8_ != local_1d8) {
      operator_delete((void *)clearColor._0_8_,local_1d8[0] + 1);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
    if (!bVar17) goto LAB_0050c54a;
  }
  bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
  pTVar16->m_code = QP_TEST_RESULT_PASS;
  (pTVar16->m_description)._M_dataplus._M_p = (pointer)&(pTVar16->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar16->m_description,bufferCreateInfo._0_8_,
             (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
  }
LAB_0050c54a:
  if (commandBuffer != 0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar14 + 0x240))(pvVar14,uVar15,uVar10,1);
  }
  if (local_98.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_90,local_98);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &subpasses.
                super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkShaderModule)
               subpasses.
               super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_140,(VkRenderPass)renderPass);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_50,local_58);
  }
  if (attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  if (uVar13 != 0) {
    (**(code **)(*(long *)uVar13 + 8))();
  }
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (uVar12 != 0) {
    (**(code **)(*(long *)uVar12 + 8))(uVar12);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_e0,(VkBuffer)obj);
  }
  if (local_408 != (long *)0x0) {
    (**(code **)(*local_408 + 8))();
  }
  if (msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  if (plVar37 != (long *)0x0) {
    (**(code **)(*plVar37 + 8))(plVar37);
  }
  if (colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  return pTVar16;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	// Color image for rendering in single-sample tests or resolve target for multi-sample tests
	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;

	// For multisampled tests, this is the rendering target
	Move<VkImage>					msColorImage;
	MovePtr<Allocation>				msColorImageAlloc;

	// Host memory buffer where we will copy the rendered image for verification
	const deUint32					att_size_x			= caseDef.attachmentSize.x();
	const deUint32					att_size_y			= caseDef.attachmentSize.y();
	const deUint32					att_size_z			= caseDef.attachmentSize.z();
	const VkDeviceSize				colorBufferSize		= att_size_x * att_size_y * att_size_z * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	vector<SharedPtrVkImageView>	colorAttachments;
	vector<VkImageView>				attachmentHandles;

	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device));
	vector<SharedPtrVkPipeline>		pipeline;
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, COLOR_FORMAT, caseDef.numLayers, caseDef.multisample));
	Move<VkFramebuffer>				framebuffer;

	const Unique<VkShaderModule>	vertexModule		(createShaderModule(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkImageViewType			imageViewType		= caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE || caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
		? VK_IMAGE_VIEW_TYPE_2D : caseDef.imageType;

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genFullQuadVertices(caseDef.numLayers);
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);

		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// create colorImage (and msColorImage) using the configured attachmentsize
	{
		const VkImageUsageFlags	colorImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;

		colorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
			caseDef.attachmentSize, caseDef.numLayers, colorImageUsage, false);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);

		if (caseDef.multisample)
		{
			const VkImageUsageFlags	msImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

			msColorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
				caseDef.attachmentSize, caseDef.numLayers, msImageUsage, true);
			msColorImageAlloc	= bindImage(vk, device, allocator, *msColorImage, MemoryRequirement::Any);
		}
	}

	// create attachmentHandles and pipelines (one for each layer). We use the renderSize for viewport and scissor
	for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
	{
		colorAttachments.push_back(makeSharedPtr(makeImageView(vk, device, ! caseDef.multisample ? *colorImage : *msColorImage,
			imageViewType, COLOR_FORMAT, makeColorSubresourceRange(layerNdx, 1))));
		attachmentHandles.push_back(**colorAttachments.back());

		pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
			caseDef.renderSize, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, layerNdx, true, caseDef.multisample)));
	}

	// create framebuffer
	framebuffer = makeFramebuffer(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
		static_cast<deUint32>(caseDef.renderSize.x()), static_cast<deUint32>(caseDef.renderSize.y()));

	// record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// Clear the entire image attachment to black
		{
			const VkImageMemoryBarrier	imageLayoutBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					0u,													// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageLayoutBarriers);

			const VkImageSubresourceRange	ranges		= makeColorSubresourceRange(0, caseDef.numLayers);
			const VkClearColorValue			clearColor	=
	        {
                {0.0f, 0.0f, 0.0f, 1.0f}
			};
			vk.cmdClearColorImage(*cmdBuffer, caseDef.multisample ? *msColorImage : *colorImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearColor, 1u, &ranges);

			const VkImageMemoryBarrier	imageClearBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			srcAccessMask;
					VK_ACCESS_COLOR_ATTACHMENT_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,							// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageClearBarriers);
		}

		// Render pass: this should render only to the area defined by renderSize (smaller than the size of the attachment)
		{
			const VkRect2D				renderArea			=
			{
				makeOffset2D(0, 0),
				makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize			vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			{
				vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
				{
					if (layerNdx != 0)
						vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

					vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[layerNdx]);
					vk.cmdDraw(*cmdBuffer, 4u, 1u, layerNdx*4u, 0u);
				}
			}
			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// If we are using a multi-sampled render target (msColorImage), resolve it now (to colorImage)
		if (caseDef.multisample)
		{
			// Transition msColorImage (from layout COLOR_ATTACHMENT_OPTIMAL) and colorImage (from layout UNDEFINED) to layout GENERAL before resolving
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*msColorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				},
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					(VkAccessFlags)0,								// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*colorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 2u, imageBarriers);

			const VkImageResolve	region	=
			{
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    srcSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  srcOffset;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    dstSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  dstOffset;
				makeExtent3D(caseDef.attachmentSize)											// VkExtent3D                  extent;
			};

			vk.cmdResolveImage(*cmdBuffer, *msColorImage, VK_IMAGE_LAYOUT_GENERAL, *colorImage, VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		}

		// copy colorImage to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,														// VkStructureType			sType;
					DE_NULL,																					// const void*				pNext;
					(vk::VkAccessFlags)(caseDef.multisample ? VK_ACCESS_TRANSFER_WRITE_BIT : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
					VK_ACCESS_TRANSFER_READ_BIT,																// VkAccessFlags			dstAccessMask;
					caseDef.multisample ? VK_IMAGE_LAYOUT_GENERAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,														// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					destQueueFamilyIndex;
					*colorImage,																				// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)												// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, caseDef.numLayers),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.attachmentSize),												// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		const int							depth			= deMax32(caseDef.attachmentSize.z(), caseDef.numLayers);
		tcu::TextureLevel					textureLevel	(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedData(textureLevel, caseDef);
		const tcu::ConstPixelBufferAccess	resultImage		(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}